

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write_decimal<long_long>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *this,longlong value)

{
  bool bVar1;
  char *pcVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  char_type buffer [26];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_58;
  char local_48 [40];
  
  uVar4 = -value;
  if (0 < value) {
    uVar4 = value;
  }
  lVar5 = 0x3f;
  if ((uVar4 | 1) != 0) {
    for (; (uVar4 | 1) >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  uVar6 = ((uint)lVar5 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar7 = (ulong)((uVar6 - (uVar4 < (ulong)(&internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64)
                                           [uVar6])) + 1);
  if (value < 0) {
    local_48[0] = '-';
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&this->out_,local_48);
  }
  pcVar2 = local_48 + uVar7;
  uVar8 = uVar4;
  if (99 < uVar4) {
    do {
      uVar4 = uVar8 / 100;
      *(undefined2 *)(pcVar2 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar8 + (int)uVar4 * -100) * 2)
      ;
      pcVar2 = pcVar2 + -2;
      bVar1 = 9999 < uVar8;
      uVar8 = uVar4;
    } while (bVar1);
  }
  local_58._M_stream = (this->out_)._M_stream;
  local_58._M_string = (this->out_)._M_string;
  if (uVar4 < 10) {
    bVar3 = (byte)uVar4 | 0x30;
    lVar5 = -1;
  }
  else {
    pcVar2[-1] = internal::basic_data<void>::DIGITS[(uVar4 * 2 & 0xffffffff) + 1];
    bVar3 = internal::basic_data<void>::DIGITS[uVar4 * 2 & 0x1fffffffe];
    lVar5 = -2;
  }
  pcVar2[lVar5] = bVar3;
  if (uVar7 != 0) {
    pcVar2 = local_48;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,pcVar2);
      pcVar2 = pcVar2 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  (this->out_)._M_stream = local_58._M_stream;
  (this->out_)._M_string = local_58._M_string;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }